

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

qpdf_offset_t __thiscall QPDF::read_xrefTable(QPDF *this,qpdf_offset_t xref_offset)

{
  long *plVar1;
  InputSource *this_00;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  bool bVar3;
  int iVar4;
  qpdf_offset_t qVar5;
  longlong lVar6;
  QPDFExc *pQVar7;
  QPDFObjGen og;
  QPDF *this_01;
  long lVar8;
  char type;
  string local_160;
  long local_140;
  int f2;
  allocator<char> local_12d;
  int bytes;
  int num;
  int obj;
  Token local_120;
  QPDFObjectHandle cur_trailer;
  string local_98;
  qpdf_offset_t f1;
  qpdf_offset_t local_70;
  undefined8 local_68;
  string line;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  plVar1 = *(long **)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  local_70 = xref_offset;
  (**(code **)(*plVar1 + 0x28))(plVar1,xref_offset,0);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    std::__cxx11::string::assign((ulong)&line,'2');
    this_01 = *(QPDF **)&(((this->m)._M_t.
                           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                           .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                         super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
    (*(code *)(((this_01->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->tokenizer).val.field_2.
              _M_allocated_capacity)(this_01,line._M_dataplus._M_p,line._M_string_length);
    obj = 0;
    num = 0;
    bytes = 0;
    bVar3 = parse_xrefFirst(this_01,&line,&obj,&num,&bytes);
    if (!bVar3) {
      pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"xref table",(allocator<char> *)&cur_trailer);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"xref syntax invalid",(allocator<char> *)&local_98);
      damagedPDF(pQVar7,this,(string *)&local_120,&local_160);
      __cxa_throw(pQVar7,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    this_00 = (((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
              super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    qVar5 = InputSource::getLastOffset(this_00);
    (*this_00->_vptr_InputSource[5])(this_00,qVar5 + bytes,0);
    local_140 = (long)obj;
    lVar8 = num + local_140;
    for (; local_140 < lVar8; local_140 = local_140 + 1) {
      if (local_140 == 0) {
        qVar5 = (**(code **)(**(long **)&(((this->m)._M_t.
                                           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                           .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                          _M_head_impl)->file).
                                         super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                            + 0x20))();
        ((this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->first_xref_item_offset = qVar5
        ;
      }
      f1 = 0;
      f2 = 0;
      type = '\0';
      bVar3 = read_xrefEntry(this,&f1,&f2,&type);
      if (!bVar3) {
        pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,"xref table",&local_12d);
        std::__cxx11::to_string(&local_98,local_140);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cur_trailer,"invalid xref entry (obj=",&local_98);
        std::operator+(&local_160,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cur_trailer,")");
        damagedPDF(pQVar7,this,(string *)&local_120,&local_160);
        __cxa_throw(pQVar7,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
      }
      if (type == 'f') {
        iVar4 = QIntC::IntConverter<long_long,_int,_true,_true>::convert(&local_140);
        og.gen = f2;
        og.obj = iVar4;
        insertFreeXrefEntry(this,og);
      }
      else {
        iVar4 = QIntC::IntConverter<long_long,_int,_true,_true>::convert(&local_140);
        insertXrefEntry(this,iVar4,1,f1,f2);
      }
    }
    local_68 = (**(code **)(**(long **)&(((this->m)._M_t.
                                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                          .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                         _M_head_impl)->file).
                                        super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                           + 0x20))();
    readToken(&local_120,this,
              (((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
              super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"trailer",(allocator<char> *)&cur_trailer);
    bVar3 = QPDFTokenizer::Token::isWord(&local_120,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    QPDFTokenizer::Token::~Token(&local_120);
    if (bVar3) break;
    plVar1 = *(long **)&(((this->m)._M_t.
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                        super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
    (**(code **)(*plVar1 + 0x28))(plVar1,local_68,0);
  }
  readTrailer((QPDF *)&cur_trailer);
  bVar3 = QPDFObjectHandle::isDictionary(&cur_trailer);
  if (!bVar3) {
    pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"",(allocator<char> *)&local_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"expected trailer dictionary",(allocator<char> *)&local_140);
    damagedPDF(pQVar7,this,(string *)&local_120,&local_160);
    __cxa_throw(pQVar7,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  if (*(long *)&(((this->m)._M_t.
                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->trailer).
                super_BaseHandle == 0) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&cur_trailer);
    setTrailer(this,(QPDFObjectHandle *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    _Var2._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"/Size",(allocator<char> *)&local_160);
    bVar3 = QPDFObjectHandle::hasKey(&(_Var2._M_head_impl)->trailer,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    if (!bVar3) {
      pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"trailer",(allocator<char> *)&local_98);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"trailer dictionary lacks /Size key",
                 (allocator<char> *)&local_140);
      damagedPDF(pQVar7,this,(string *)&local_120,&local_160);
      __cxa_throw(pQVar7,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    _Var2._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"/Size",(allocator<char> *)&local_98);
    QPDFObjectHandle::getKey
              ((QPDFObjectHandle *)&local_160,(string *)&(_Var2._M_head_impl)->trailer);
    bVar3 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)&local_160);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_160._M_string_length);
    std::__cxx11::string::~string((string *)&local_120);
    if (!bVar3) {
      pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"trailer",(allocator<char> *)&local_98);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"/Size key in trailer dictionary is not an integer",
                 (allocator<char> *)&local_140);
      damagedPDF(pQVar7,this,(string *)&local_120,&local_160);
      __cxa_throw(pQVar7,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"/XRefStm",(allocator<char> *)&local_160);
  bVar3 = QPDFObjectHandle::hasKey(&cur_trailer,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  if ((bVar3) &&
     (((this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->ignore_xref_streams == false)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"/XRefStm",(allocator<char> *)&local_98);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_160,(string *)&cur_trailer);
    bVar3 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)&local_160);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_160._M_string_length);
    std::__cxx11::string::~string((string *)&local_120);
    if (!bVar3) {
      pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"xref stream",(allocator<char> *)&local_98);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"invalid /XRefStm",(allocator<char> *)&local_140);
      damagedPDF(pQVar7,this,(string *)&local_120,local_70,&local_160);
      __cxa_throw(pQVar7,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"/XRefStm",(allocator<char> *)&local_98);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_160,(string *)&cur_trailer);
    lVar6 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)&local_160);
    read_xrefStream(this,lVar6);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_160._M_string_length);
    std::__cxx11::string::~string((string *)&local_120);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"/Prev",(allocator<char> *)&local_160);
  bVar3 = QPDFObjectHandle::hasKey(&cur_trailer,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"/Prev",(allocator<char> *)&local_98);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_160,(string *)&cur_trailer);
    bVar3 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)&local_160);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_160._M_string_length);
    std::__cxx11::string::~string((string *)&local_120);
    if (!bVar3) {
      pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"trailer",(allocator<char> *)&local_98);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"/Prev key in trailer dictionary is not an integer",
                 (allocator<char> *)&local_140);
      damagedPDF(pQVar7,this,(string *)&local_120,&local_160);
      __cxa_throw(pQVar7,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"/Prev",(allocator<char> *)&local_98);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_160,(string *)&cur_trailer);
    lVar6 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)&local_160);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_160._M_string_length);
    std::__cxx11::string::~string((string *)&local_120);
  }
  else {
    lVar6 = 0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&cur_trailer.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&line);
  return lVar6;
}

Assistant:

qpdf_offset_t
QPDF::read_xrefTable(qpdf_offset_t xref_offset)
{
    m->file->seek(xref_offset, SEEK_SET);
    std::string line;
    while (true) {
        line.assign(50, '\0');
        m->file->read(line.data(), line.size());
        int obj = 0;
        int num = 0;
        int bytes = 0;
        if (!parse_xrefFirst(line, obj, num, bytes)) {
            QTC::TC("qpdf", "QPDF invalid xref");
            throw damagedPDF("xref table", "xref syntax invalid");
        }
        m->file->seek(m->file->getLastOffset() + bytes, SEEK_SET);
        for (qpdf_offset_t i = obj; i - num < obj; ++i) {
            if (i == 0) {
                // This is needed by checkLinearization()
                m->first_xref_item_offset = m->file->tell();
            }
            // For xref_table, these will always be small enough to be ints
            qpdf_offset_t f1 = 0;
            int f2 = 0;
            char type = '\0';
            if (!read_xrefEntry(f1, f2, type)) {
                QTC::TC("qpdf", "QPDF invalid xref entry");
                throw damagedPDF(
                    "xref table", "invalid xref entry (obj=" + std::to_string(i) + ")");
            }
            if (type == 'f') {
                insertFreeXrefEntry(QPDFObjGen(toI(i), f2));
            } else {
                insertXrefEntry(toI(i), 1, f1, f2);
            }
        }
        qpdf_offset_t pos = m->file->tell();
        if (readToken(*m->file).isWord("trailer")) {
            break;
        } else {
            m->file->seek(pos, SEEK_SET);
        }
    }

    // Set offset to previous xref table if any
    QPDFObjectHandle cur_trailer = readTrailer();
    if (!cur_trailer.isDictionary()) {
        QTC::TC("qpdf", "QPDF missing trailer");
        throw damagedPDF("", "expected trailer dictionary");
    }

    if (!m->trailer) {
        setTrailer(cur_trailer);

        if (!m->trailer.hasKey("/Size")) {
            QTC::TC("qpdf", "QPDF trailer lacks size");
            throw damagedPDF("trailer", "trailer dictionary lacks /Size key");
        }
        if (!m->trailer.getKey("/Size").isInteger()) {
            QTC::TC("qpdf", "QPDF trailer size not integer");
            throw damagedPDF("trailer", "/Size key in trailer dictionary is not an integer");
        }
    }

    if (cur_trailer.hasKey("/XRefStm")) {
        if (m->ignore_xref_streams) {
            QTC::TC("qpdf", "QPDF ignoring XRefStm in trailer");
        } else {
            if (cur_trailer.getKey("/XRefStm").isInteger()) {
                // Read the xref stream but disregard any return value -- we'll use our trailer's
                // /Prev key instead of the xref stream's.
                (void)read_xrefStream(cur_trailer.getKey("/XRefStm").getIntValue());
            } else {
                throw damagedPDF("xref stream", xref_offset, "invalid /XRefStm");
            }
        }
    }

    if (cur_trailer.hasKey("/Prev")) {
        if (!cur_trailer.getKey("/Prev").isInteger()) {
            QTC::TC("qpdf", "QPDF trailer prev not integer");
            throw damagedPDF("trailer", "/Prev key in trailer dictionary is not an integer");
        }
        QTC::TC("qpdf", "QPDF prev key in trailer dictionary");
        return cur_trailer.getKey("/Prev").getIntValue();
    }

    return 0;
}